

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangical.cpp
# Opt level: O2

int __thiscall
icu_63::DangiCalendar::clone
          (DangiCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DangiCalendar *this_00;
  
  this_00 = (DangiCalendar *)UMemory::operator_new((UMemory *)0x270,(size_t)__fn);
  if (this_00 != (DangiCalendar *)0x0) {
    DangiCalendar(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Calendar*
DangiCalendar::clone() const
{
    return new DangiCalendar(*this);
}